

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O1

bool __thiscall TiXmlDocument::LoadFile(TiXmlDocument *this,FILE *file,TiXmlEncoding encoding)

{
  char cVar1;
  TiXmlNode *pTVar2;
  TiXmlBase *pTVar3;
  size_t __size;
  char *__ptr;
  size_t sVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  int err;
  
  if (file != (FILE *)0x0) {
    pTVar2 = (this->super_TiXmlNode).firstChild;
    while (pTVar2 != (TiXmlNode *)0x0) {
      pTVar3 = &pTVar2->super_TiXmlBase;
      pTVar2 = pTVar2->next;
      (*pTVar3->_vptr_TiXmlBase[1])();
    }
    (this->super_TiXmlNode).firstChild = (TiXmlNode *)0x0;
    (this->super_TiXmlNode).lastChild = (TiXmlNode *)0x0;
    (this->super_TiXmlNode).super_TiXmlBase.location.row = -1;
    (this->super_TiXmlNode).super_TiXmlBase.location.col = -1;
    fseek((FILE *)file,0,2);
    __size = ftell((FILE *)file);
    fseek((FILE *)file,0,0);
    if ((long)__size < 1) {
      err = 0xc;
      goto LAB_00180a97;
    }
    __ptr = (char *)operator_new__(__size + 1);
    *__ptr = '\0';
    sVar4 = fread(__ptr,__size,1,(FILE *)file);
    if (sVar4 == 1) {
      pcVar5 = __ptr + __size;
      __ptr[__size] = '\0';
      cVar1 = *__ptr;
      pcVar6 = __ptr;
      pcVar7 = __ptr;
      while( true ) {
        if (cVar1 == '\0') {
          if (pcVar6 <= pcVar5) {
            *pcVar6 = '\0';
            (*(this->super_TiXmlNode).super_TiXmlBase._vptr_TiXmlBase[3])
                      (this,__ptr,0,(ulong)encoding);
            operator_delete__(__ptr);
            return (bool)(this->error ^ 1);
          }
          __assert_fail("q <= (buf+length)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                        ,0x432,"bool TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)");
        }
        if (pcVar5 <= pcVar7) {
          __assert_fail("p < (buf+length)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                        ,0x423,"bool TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)");
        }
        if (pcVar5 < pcVar6) break;
        if (pcVar7 < pcVar6) {
          __assert_fail("q <= p",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                        ,0x425,"bool TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)");
        }
        if (cVar1 == '\r') {
          *pcVar6 = '\n';
          if (pcVar7[1] == '\n') {
            pcVar7 = pcVar7 + 2;
          }
          else {
            pcVar7 = pcVar7 + 1;
          }
        }
        else {
          pcVar7 = pcVar7 + 1;
          *pcVar6 = cVar1;
        }
        pcVar6 = pcVar6 + 1;
        cVar1 = *pcVar7;
      }
      __assert_fail("q <= (buf+length)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/LiangLin0316[P]HZRobot/Include/xml/Source/tinyxml.cpp"
                    ,0x424,"bool TiXmlDocument::LoadFile(FILE *, TiXmlEncoding)");
    }
    operator_delete__(__ptr);
  }
  err = 2;
LAB_00180a97:
  SetError(this,err,(char *)0x0,(TiXmlParsingData *)0x0,TIXML_ENCODING_UNKNOWN);
  return false;
}

Assistant:

bool TiXmlDocument::LoadFile( FILE* file, TiXmlEncoding encoding )
{
	if ( !file ) 
	{
		SetError( TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN );
		return false;
	}

	// Delete the existing data:
	Clear();
	location.Clear();

	// Get the file size, so we can pre-allocate the string. HUGE speed impact.
	long length = 0;
	fseek( file, 0, SEEK_END );
	length = ftell( file );
	fseek( file, 0, SEEK_SET );

	// Strange case, but good to handle up front.
	if ( length <= 0 )
	{
		SetError( TIXML_ERROR_DOCUMENT_EMPTY, 0, 0, TIXML_ENCODING_UNKNOWN );
		return false;
	}

	// Subtle bug here. TinyXml did use fgets. But from the XML spec:
	// 2.11 End-of-Line Handling
	// <snip>
	// <quote>
	// ...the XML processor MUST behave as if it normalized all line breaks in external 
	// parsed entities (including the document entity) on input, before parsing, by translating 
	// both the two-character sequence #xD #xA and any #xD that is not followed by #xA to 
	// a single #xA character.
	// </quote>
	//
	// It is not clear fgets does that, and certainly isn't clear it works cross platform. 
	// Generally, you expect fgets to translate from the convention of the OS to the c/unix
	// convention, and not work generally.

	/*
	while( fgets( buf, sizeof(buf), file ) )
	{
		data += buf;
	}
	*/

	char* buf = new char[ length+1 ];
	buf[0] = 0;

	if ( fread( buf, length, 1, file ) != 1 ) {
		delete [] buf;
		SetError( TIXML_ERROR_OPENING_FILE, 0, 0, TIXML_ENCODING_UNKNOWN );
		return false;
	}

	// Process the buffer in place to normalize new lines. (See comment above.)
	// Copies from the 'p' to 'q' pointer, where p can advance faster if
	// a newline-carriage return is hit.
	//
	// Wikipedia:
	// Systems based on ASCII or a compatible character set use either LF  (Line feed, '\n', 0x0A, 10 in decimal) or 
	// CR (Carriage return, '\r', 0x0D, 13 in decimal) individually, or CR followed by LF (CR+LF, 0x0D 0x0A)...
	//		* LF:    Multics, Unix and Unix-like systems (GNU/Linux, AIX, Xenix, Mac OS X, FreeBSD, etc.), BeOS, Amiga, RISC OS, and others
    //		* CR+LF: DEC RT-11 and most other early non-Unix, non-IBM OSes, CP/M, MP/M, DOS, OS/2, Microsoft Windows, Symbian OS
    //		* CR:    Commodore 8-bit machines, Apple II family, Mac OS up to version 9 and OS-9

	const char* p = buf;	// the read head
	char* q = buf;			// the write head
	const char CR = 0x0d;
	const char LF = 0x0a;

	buf[length] = 0;
	while( *p ) {
		assert( p < (buf+length) );
		assert( q <= (buf+length) );
		assert( q <= p );

		if ( *p == CR ) {
			*q++ = LF;
			p++;
			if ( *p == LF ) {		// check for CR+LF (and skip LF)
				p++;
			}
		}
		else {
			*q++ = *p++;
		}
	}
	assert( q <= (buf+length) );
	*q = 0;

	Parse( buf, 0, encoding );

	delete [] buf;
	return !Error();
}